

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten.cpp
# Opt level: O1

int __thiscall ncnn::Flatten::forward(Flatten *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  void *pvVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar9 = (long)bottom_blob->h * (long)bottom_blob->w;
  uVar1 = bottom_blob->c;
  Mat::create(top_blob,(int)uVar9 * uVar1,bottom_blob->elemsize,opt->blob_allocator);
  iVar4 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    if (0 < (int)uVar1) {
      pvVar5 = bottom_blob->data;
      sVar2 = bottom_blob->cstep;
      pvVar6 = top_blob->data;
      sVar3 = bottom_blob->elemsize;
      uVar7 = 0;
      do {
        if (0 < (int)uVar9) {
          uVar8 = 0;
          do {
            *(undefined4 *)((long)pvVar6 + uVar8 * 4) = *(undefined4 *)((long)pvVar5 + uVar8 * 4);
            uVar8 = uVar8 + 1;
          } while ((uVar9 & 0xffffffff) != uVar8);
        }
        uVar7 = uVar7 + 1;
        pvVar6 = (void *)((long)pvVar6 + uVar9 * 4);
        pvVar5 = (void *)((long)pvVar5 + sVar2 * sVar3);
      } while (uVar7 != uVar1);
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int Flatten::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(size * channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);
        float* outptr = (float*)top_blob + size * q;

        for (int i=0; i<size; i++)
        {
            outptr[i] = ptr[i];
        }
    }

    return 0;
}